

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

bool __thiscall VmaBlockMetadata_TLSF::Validate(VmaBlockMetadata_TLSF *this)

{
  VmaBlockBufferImageGranularity *this_00;
  VkDeviceSize offset;
  VkDeviceSize size;
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  Block *pBVar3;
  undefined4 extraout_var_00;
  VkDeviceSize VVar4;
  VkDeviceSize VVar5;
  ulong uVar6;
  Block *pBVar7;
  bool bVar8;
  ValidationContext validateCtx;
  size_t local_58;
  VkDeviceSize local_50;
  size_t local_48;
  ValidationContext local_40;
  
  iVar1 = (*(this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata[6])();
  if (CONCAT44(extraout_var,iVar1) <= (this->super_VmaBlockMetadata).m_Size) {
    VVar5 = this->m_NullBlock->size;
    if ((ulong)this->m_ListsCount != 0) {
      uVar6 = 0;
      do {
        pBVar7 = this->m_FreeList[uVar6];
        if (pBVar7 != (Block *)0x0) {
          if (pBVar7->prevFree != (Block *)0x0) {
            return false;
          }
          while (pBVar3 = (pBVar7->field_5).nextFree, pBVar3 != (Block *)0x0) {
            if (pBVar3->prevFree == pBVar3) {
              return false;
            }
            bVar8 = pBVar3->prevFree != pBVar7;
            pBVar7 = pBVar3;
            if (bVar8) {
              return false;
            }
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != this->m_ListsCount);
    }
    VVar4 = this->m_NullBlock->offset;
    this_00 = &this->m_GranularityHandler;
    local_40 = VmaBlockBufferImageGranularity::StartValidation
                         (this_00,(this->super_VmaBlockMetadata).m_pAllocationCallbacks,
                          (this->super_VmaBlockMetadata).m_IsVirtual);
    pBVar7 = this->m_NullBlock;
    if ((pBVar7->nextPhysical == (Block *)0x0) &&
       ((pBVar7->prevPhysical == (Block *)0x0 || (pBVar7->prevPhysical->nextPhysical == pBVar7)))) {
      local_58 = 0;
      local_48 = 0;
      local_50 = VVar5;
      do {
        pBVar7 = pBVar7->prevPhysical;
        if (pBVar7 == (Block *)0x0) break;
        offset = pBVar7->offset;
        size = pBVar7->size;
        if (offset + size != VVar4) break;
        uVar2 = GetListIndex(this,size);
        if (pBVar7->prevFree == pBVar7) {
          local_58 = local_58 + 1;
          for (pBVar3 = this->m_FreeList[uVar2]; pBVar3 != (Block *)0x0;
              pBVar3 = (pBVar3->field_5).nextFree) {
            if (pBVar3 == pBVar7) goto LAB_001bbde7;
          }
          if (((this->super_VmaBlockMetadata).m_IsVirtual != false) ||
             (bVar8 = VmaBlockBufferImageGranularity::Validate(this_00,&local_40,offset,size), bVar8
             )) goto LAB_001bbdd8;
LAB_001bbde7:
          bVar8 = false;
        }
        else {
          pBVar3 = this->m_FreeList[uVar2];
          bVar8 = false;
          if (pBVar3 != (Block *)0x0) {
            do {
              if (pBVar3 == pBVar7) {
                bVar8 = true;
              }
            } while ((!bVar8) && (pBVar3 = (pBVar3->field_5).nextFree, pBVar3 != (Block *)0x0));
            VVar4 = 0;
            if (bVar8) {
              VVar4 = size;
            }
            local_50 = local_50 + VVar4;
          }
          local_48 = local_48 + 1;
          if (!bVar8) goto LAB_001bbde7;
LAB_001bbdd8:
          if ((pBVar7->prevPhysical != (Block *)0x0) &&
             (pBVar7->prevPhysical->nextPhysical != pBVar7)) goto LAB_001bbde7;
          bVar8 = true;
        }
        VVar5 = VVar5 + size;
        VVar4 = offset;
      } while (bVar8);
      if (pBVar7 == (Block *)0x0) {
        if ((this->super_VmaBlockMetadata).m_IsVirtual == false) {
          bVar8 = VmaBlockBufferImageGranularity::FinishValidation(this_00,&local_40);
          if (!bVar8) {
            return false;
          }
          if (VVar4 != 0) {
            return false;
          }
        }
        else if (VVar4 != 0) {
          return false;
        }
        if (VVar5 == (this->super_VmaBlockMetadata).m_Size) {
          iVar1 = (*(this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata[6])(this);
          if (local_50 != CONCAT44(extraout_var_00,iVar1)) {
            return false;
          }
          if (local_58 == this->m_AllocCount) {
            return local_48 == this->m_BlocksFreeCount;
          }
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool VmaBlockMetadata_TLSF::Validate() const
{
    VMA_VALIDATE(GetSumFreeSize() <= GetSize());

    VkDeviceSize calculatedSize = m_NullBlock->size;
    VkDeviceSize calculatedFreeSize = m_NullBlock->size;
    size_t allocCount = 0;
    size_t freeCount = 0;

    // Check integrity of free lists
    for (uint32_t list = 0; list < m_ListsCount; ++list)
    {
        Block* block = m_FreeList[list];
        if (block != VMA_NULL)
        {
            VMA_VALIDATE(block->IsFree());
            VMA_VALIDATE(block->PrevFree() == VMA_NULL);
            while (block->NextFree())
            {
                VMA_VALIDATE(block->NextFree()->IsFree());
                VMA_VALIDATE(block->NextFree()->PrevFree() == block);
                block = block->NextFree();
            }
        }
    }

    VkDeviceSize nextOffset = m_NullBlock->offset;
    auto validateCtx = m_GranularityHandler.StartValidation(GetAllocationCallbacks(), IsVirtual());

    VMA_VALIDATE(m_NullBlock->nextPhysical == VMA_NULL);
    if (m_NullBlock->prevPhysical)
    {
        VMA_VALIDATE(m_NullBlock->prevPhysical->nextPhysical == m_NullBlock);
    }
    // Check all blocks
    for (Block* prev = m_NullBlock->prevPhysical; prev != VMA_NULL; prev = prev->prevPhysical)
    {
        VMA_VALIDATE(prev->offset + prev->size == nextOffset);
        nextOffset = prev->offset;
        calculatedSize += prev->size;

        uint32_t listIndex = GetListIndex(prev->size);
        if (prev->IsFree())
        {
            ++freeCount;
            // Check if free block belongs to free list
            Block* freeBlock = m_FreeList[listIndex];
            VMA_VALIDATE(freeBlock != VMA_NULL);

            bool found = false;
            do
            {
                if (freeBlock == prev)
                    found = true;

                freeBlock = freeBlock->NextFree();
            } while (!found && freeBlock != VMA_NULL);

            VMA_VALIDATE(found);
            calculatedFreeSize += prev->size;
        }
        else
        {
            ++allocCount;
            // Check if taken block is not on a free list
            Block* freeBlock = m_FreeList[listIndex];
            while (freeBlock)
            {
                VMA_VALIDATE(freeBlock != prev);
                freeBlock = freeBlock->NextFree();
            }

            if (!IsVirtual())
            {
                VMA_VALIDATE(m_GranularityHandler.Validate(validateCtx, prev->offset, prev->size));
            }
        }

        if (prev->prevPhysical)
        {
            VMA_VALIDATE(prev->prevPhysical->nextPhysical == prev);
        }
    }

    if (!IsVirtual())
    {
        VMA_VALIDATE(m_GranularityHandler.FinishValidation(validateCtx));
    }

    VMA_VALIDATE(nextOffset == 0);
    VMA_VALIDATE(calculatedSize == GetSize());
    VMA_VALIDATE(calculatedFreeSize == GetSumFreeSize());
    VMA_VALIDATE(allocCount == m_AllocCount);
    VMA_VALIDATE(freeCount == m_BlocksFreeCount);

    return true;
}